

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void gz_uncompress(gzFile in,FILE *out)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *msg;
  int err;
  char buf [16384];
  
  while( true ) {
    uVar1 = gzread(in,buf,0x4000);
    if ((int)uVar1 < 0) {
      msg = (char *)gzerror(in,&err);
      error(msg);
    }
    if (uVar1 == 0) break;
    sVar3 = fwrite(buf,1,(ulong)uVar1,(FILE *)out);
    if (uVar1 != (uint)sVar3) {
      error("failed fwrite");
    }
  }
  iVar2 = fclose((FILE *)out);
  if (iVar2 != 0) {
    error("failed fclose");
  }
  iVar2 = gzclose(in);
  if (iVar2 == 0) {
    return;
  }
  error("failed gzclose");
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}